

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader_mocks.cpp
# Opt level: O3

refiller_function * yield_string(refiller_function *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  long *plVar2;
  string *psVar3;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + str->_M_string_length);
  plVar2 = local_48;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  psVar3 = (string *)operator_new(0x20);
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,plVar2,local_40 + (long)plVar2);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = psVar3;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/buffered_reader_mocks.cpp:58:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/buffered_reader_mocks.cpp:58:12)>
       ::_M_manager;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

refiller_function yield_string (std::string const & str) {
    return [str] (int io, pstore::gsl::span<std::uint8_t> const & s) {
        PSTORE_ASSERT (str.length () <= pstore::unsigned_cast (s.size ()));
        return refiller_result_type{
            pstore::in_place, io + 1,
            std::transform (str.begin (), str.end (), s.begin (), [] (std::uint8_t v) {
                PSTORE_ASSERT (v < 128);
                return static_cast<char> (v);
            })};
    };
}